

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O0

void __thiscall BufferedFileWriter::~BufferedFileWriter(BufferedFileWriter *this)

{
  bool bVar1;
  undefined1 local_30 [8];
  WriterData writerData;
  BufferedFileWriter *this_local;
  
  writerData._24_8_ = this;
  terminate(this);
  while( true ) {
    bVar1 = SafeQueue<WriterData>::empty((SafeQueue<WriterData> *)&this->m_writeQueue);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    WaitableSafeQueue<WriterData>::pop((WriterData *)local_30,&this->m_writeQueue);
    WriterData::execute((WriterData *)local_30);
  }
  WaitableSafeQueue<WriterData>::~WaitableSafeQueue(&this->m_writeQueue);
  std::__cxx11::string::~string((string *)&this->m_lastErrorStr);
  TerminatableThread::~TerminatableThread(&this->super_TerminatableThread);
  return;
}

Assistant:

BufferedFileWriter::~BufferedFileWriter()
{
    terminate();
    while (!m_writeQueue.empty())
    {
        WriterData writerData = m_writeQueue.pop();
        writerData.execute();
    }
}